

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O3

void double_conversion::FillDigits64(uint64_t number,Vector<char> buffer,int *length)

{
  uint uVar1;
  char *pcVar2;
  int *piVar3;
  uint number_00;
  char *pcVar4;
  ulong uVar5;
  
  piVar3 = buffer._8_8_;
  pcVar4 = buffer.start_;
  number_00 = (int)number + (int)(number / 10000000) * -10000000;
  uVar5 = (number / 10000000) % 10000000;
  if (number < 100000000000000) {
    if (uVar5 == 0) {
      FillDigits32(number_00,buffer,(int *)0x1ad7f29abcb);
      return;
    }
    FillDigits32((uint32_t)uVar5,buffer,(int *)0x1ad7f29abcb);
    pcVar4 = pcVar4 + 6;
    uVar1 = 8;
    do {
      pcVar4[*piVar3] = (char)number_00 + (char)(number_00 / 10) * -10 | 0x30;
      uVar1 = uVar1 - 1;
      pcVar4 = pcVar4 + -1;
      number_00 = number_00 / 10;
    } while (1 < uVar1);
  }
  else {
    FillDigits32((uint32_t)(number / 100000000000000),buffer,(int *)0xb424dc35095cd81);
    pcVar2 = pcVar4 + 6;
    uVar1 = 8;
    do {
      pcVar2[*piVar3] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
      uVar1 = uVar1 - 1;
      pcVar2 = pcVar2 + -1;
      uVar5 = uVar5 / 10;
    } while (1 < uVar1);
    *piVar3 = *piVar3 + 7;
    pcVar4 = pcVar4 + 6;
    uVar1 = 8;
    do {
      pcVar4[*piVar3] = (char)number_00 + (char)(number_00 / 10) * -10 | 0x30;
      uVar1 = uVar1 - 1;
      pcVar4 = pcVar4 + -1;
      number_00 = number_00 / 10;
    } while (1 < uVar1);
  }
  *piVar3 = *piVar3 + 7;
  return;
}

Assistant:

static void FillDigits64(uint64_t number, Vector<char> buffer, int* length) {
  const uint32_t kTen7 = 10000000;
  // For efficiency cut the number into 3 uint32_t parts, and print those.
  uint32_t part2 = static_cast<uint32_t>(number % kTen7);
  number /= kTen7;
  uint32_t part1 = static_cast<uint32_t>(number % kTen7);
  uint32_t part0 = static_cast<uint32_t>(number / kTen7);

  if (part0 != 0) {
    FillDigits32(part0, buffer, length);
    FillDigits32FixedLength(part1, 7, buffer, length);
    FillDigits32FixedLength(part2, 7, buffer, length);
  } else if (part1 != 0) {
    FillDigits32(part1, buffer, length);
    FillDigits32FixedLength(part2, 7, buffer, length);
  } else {
    FillDigits32(part2, buffer, length);
  }
}